

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O3

void __thiscall Assimp::glTF2Importer::ImportMeshes(glTF2Importer *this,Asset *r)

{
  pointer *ppuVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  PrimitiveMode PVar7;
  undefined4 uVar8;
  iterator iVar9;
  pointer pPVar10;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *pvVar11;
  vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *pvVar12;
  BufferView *pBVar13;
  vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *pvVar14;
  long lVar15;
  aiScene *paVar16;
  glTF2Importer *pgVar17;
  iterator iVar18;
  uint uVar19;
  uint uVar20;
  pointer ppMVar21;
  aiMesh *paVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  aiVector3D *paVar24;
  long lVar25;
  pointer pRVar26;
  float *pfVar27;
  Logger *pLVar28;
  long *plVar29;
  aiAnimMesh **ppaVar30;
  aiAnimMesh *paVar31;
  Accessor *pAVar32;
  ulong *puVar33;
  aiFace *paVar34;
  uint **ppuVar35;
  uint *puVar36;
  int *piVar37;
  undefined8 *puVar38;
  undefined4 *puVar39;
  aiMesh **ppaVar40;
  ulong uVar41;
  _func_int **pp_Var42;
  ulong uVar43;
  int iVar44;
  aiMesh **ppaVar45;
  aiMesh **ppaVar46;
  uint uVar47;
  uint uVar48;
  char *pcVar49;
  pointer pPVar50;
  aiFace *paVar51;
  size_t *psVar52;
  ulong *puVar53;
  ulong uVar54;
  ulong uVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  aiMesh *aim;
  Tangent *tangents;
  uint k;
  aiVector3D *tangentDiff;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  aiMesh *local_f8;
  pointer local_f0;
  Indexer local_e8;
  ulong local_c8;
  ulong local_c0;
  uint local_b4;
  aiFace *local_b0;
  ulong local_a8;
  Mesh *local_a0;
  glTF2Importer *local_98;
  ulong local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  aiMesh **local_68;
  iterator iStack_60;
  aiMesh **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_48;
  Asset *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_68 = (aiMesh **)0x0;
  iStack_60._M_current = (aiMesh **)0x0;
  local_58 = (aiMesh **)0x0;
  local_b4 = 0;
  ppMVar21 = (r->meshes).mObjs.super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_98 = this;
  local_40 = r;
  if (((long)(r->meshes).mObjs.super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar21 & 0x7fffffff8U) != 0) {
    local_48 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->meshOffsets;
    uVar55 = 0;
    do {
      local_a0 = ppMVar21[uVar55];
      iVar9._M_current =
           (local_98->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (local_98->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_48,iVar9,&local_b4);
      }
      else {
        *iVar9._M_current = local_b4;
        ppuVar1 = &(local_98->meshOffsets).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      pPVar50 = (local_a0->primitives).
                super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar10 = *(pointer *)
                 ((long)&(local_a0->primitives).
                         super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                         ._M_impl + 8);
      local_b4 = (int)((ulong)((long)pPVar10 - (long)pPVar50) >> 8) + local_b4;
      if (pPVar10 != pPVar50) {
        local_50 = &(local_a0->super_Object).name;
        local_38 = &(local_a0->super_Object).id;
        local_90 = 0;
        do {
          uVar43 = local_90;
          paVar22 = (aiMesh *)operator_new(0x520);
          paVar22->mPrimitiveTypes = 0;
          paVar22->mNumVertices = 0;
          paVar22->mNumFaces = 0;
          memset(&paVar22->mVertices,0,0xcc);
          paVar22->mBones = (aiBone **)0x0;
          paVar22->mMaterialIndex = 0;
          (paVar22->mName).length = 0;
          (paVar22->mName).data[0] = '\0';
          memset((paVar22->mName).data + 1,0x1b,0x3ff);
          paVar22->mNumAnimMeshes = 0;
          paVar22->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar22->mMethod = 0;
          (paVar22->mAABB).mMin.x = 0.0;
          (paVar22->mAABB).mMin.y = 0.0;
          (paVar22->mAABB).mMin.z = 0.0;
          (paVar22->mAABB).mMax.x = 0.0;
          (paVar22->mAABB).mMax.y = 0.0;
          (paVar22->mAABB).mMax.z = 0.0;
          memset(paVar22->mColors,0,0xa0);
          local_f8 = paVar22;
          if (iStack_60._M_current == local_58) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_68,iStack_60,&local_f8);
          }
          else {
            *iStack_60._M_current = paVar22;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
          paVar22 = local_f8;
          pbVar23 = local_50;
          if ((local_a0->super_Object).name._M_string_length == 0) {
            pbVar23 = local_38;
          }
          uVar41 = pbVar23->_M_string_length;
          if (uVar41 < 0x400) {
            (local_f8->mName).length = (ai_uint32)uVar41;
            memcpy((local_f8->mName).data,(pbVar23->_M_dataplus)._M_p,uVar41);
            (paVar22->mName).data[uVar41] = '\0';
          }
          if (0x100 < (ulong)((long)*(pointer *)
                                     ((long)&(local_a0->primitives).
                                             super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                             ._M_impl + 8) -
                             *(long *)&(local_a0->primitives).
                                       super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                       ._M_impl.super__Vector_impl_data)) {
            uVar19 = (local_f8->mName).length;
            (local_f8->mName).data[uVar19] = '-';
            pcVar49 = (local_f8->mName).data + (ulong)uVar19 + 1;
            uVar47 = 0x3ff - uVar19;
            uVar48 = 1;
            uVar41 = local_90;
            if (((int)local_90 < 0) && (1 < uVar47)) {
              (local_f8->mName).data[(ulong)uVar19 + 1] = '-';
              pcVar49 = (local_f8->mName).data + (ulong)uVar19 + 2;
              uVar41 = (ulong)(uint)-(int)local_90;
              uVar48 = 2;
            }
            if (uVar48 < uVar47) {
              iVar44 = 1000000000;
              bVar56 = false;
              do {
                uVar54 = (ulong)(uint)((int)uVar41 >> 0x1f) << 0x20 | uVar41 & 0xffffffff;
                lVar25 = (long)uVar54 / (long)iVar44;
                bVar57 = (int)lVar25 != 0;
                bVar58 = iVar44 == 1;
                if ((bVar56 || bVar58) || bVar57) {
                  *pcVar49 = (char)lVar25 + '0';
                  pcVar49 = pcVar49 + 1;
                  uVar48 = uVar48 + 1;
                  uVar41 = (long)uVar54 % (long)iVar44 & 0xffffffff;
                  if (iVar44 == 1) break;
                }
                iVar44 = iVar44 / 10;
                bVar56 = (bool)(bVar56 | bVar58 | bVar57);
              } while (uVar48 < uVar47);
            }
            *pcVar49 = '\0';
            (local_f8->mName).length = (local_f8->mName).length + uVar48;
          }
          local_f0 = pPVar50 + uVar43;
          if ((ulong)local_f0->mode < 7) {
            local_f8->mPrimitiveTypes =
                 local_f8->mPrimitiveTypes | *(uint *)(&DAT_006fc024 + (ulong)local_f0->mode * 4);
          }
          pRVar26 = *(pointer *)
                     &(local_f0->attributes).position.
                      super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ._M_impl;
          if ((*(pointer *)
                ((long)&(local_f0->attributes).position.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                + 8) != pRVar26) &&
             (pRVar26->vector !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0)) {
            local_f8->mNumVertices =
                 *(uint *)(*(long *)(*(long *)&(pRVar26->vector->
                                               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                               )._M_impl + (ulong)pRVar26->index * 8) + 0x70);
            puVar38 = *(undefined8 **)
                       &(local_f0->attributes).position.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ._M_impl;
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)(*(long *)*puVar38 + (ulong)*(uint *)(puVar38 + 1) * 8),
                       &local_f8->mVertices);
          }
          pRVar26 = (local_f0->attributes).normal.
                    super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((*(pointer *)
                ((long)&(local_f0->attributes).normal.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                + 8) != pRVar26) &&
             (pRVar26->vector !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0)) {
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (*(long *)&(pRVar26->vector->
                                   super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                   )._M_impl + (ulong)pRVar26->index * 8),&local_f8->mNormals);
            pRVar26 = (local_f0->attributes).tangent.
                      super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((*(pointer *)
                  ((long)&(local_f0->attributes).tangent.
                          super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                  + 8) != pRVar26) &&
               (pRVar26->vector !=
                (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0)) {
              local_e8.accessor = (Accessor *)0x0;
              glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                        (*(Accessor **)
                          (*(long *)&(pRVar26->vector->
                                     super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                     )._M_impl + (ulong)pRVar26->index * 8),(Tangent **)&local_e8);
              paVar22 = local_f8;
              uVar19 = local_f8->mNumVertices;
              uVar43 = (ulong)uVar19 * 0xc;
              paVar24 = (aiVector3D *)operator_new__(uVar43);
              if (uVar19 != 0) {
                memset(paVar24,0,((uVar43 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar22->mTangents = paVar24;
              uVar19 = paVar22->mNumVertices;
              uVar43 = (ulong)uVar19 * 0xc;
              paVar24 = (aiVector3D *)operator_new__(uVar43);
              if (uVar19 != 0) {
                memset(paVar24,0,((uVar43 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar22->mBitangents = paVar24;
              if (paVar22->mNumVertices == 0) {
                if (local_e8.accessor == (Accessor *)0x0) goto LAB_00646aba;
              }
              else {
                lVar25 = 0;
                uVar43 = 0;
                pAVar32 = local_e8.accessor;
                do {
                  paVar24 = paVar22->mTangents;
                  *(int *)((long)&paVar24->z + lVar25) =
                       (int)*(size_t *)&(pAVar32->super_Object).index;
                  *(_func_int ***)((long)&paVar24->x + lVar25) =
                       (pAVar32->super_Object)._vptr_Object;
                  fVar2 = *(float *)&(pAVar32->super_Object)._vptr_Object;
                  paVar24 = paVar22->mBitangents;
                  fVar3 = *(float *)((long)&paVar22->mNormals->x + lVar25);
                  fVar4 = (float)(pAVar32->super_Object).oIndex;
                  uVar5 = *(undefined8 *)((long)&paVar22->mNormals->y + lVar25);
                  uVar6 = *(undefined8 *)((long)&(pAVar32->super_Object)._vptr_Object + 4);
                  fVar59 = (float)uVar5;
                  fVar60 = (float)((ulong)uVar5 >> 0x20);
                  fVar61 = (float)uVar6;
                  fVar62 = (float)((ulong)uVar6 >> 0x20);
                  *(ulong *)((long)&paVar24->x + lVar25) =
                       CONCAT44(fVar4 * (fVar2 * fVar60 - fVar3 * fVar62),
                                fVar4 * (fVar62 * fVar59 - fVar60 * fVar61));
                  *(float *)((long)&paVar24->z + lVar25) = (fVar3 * fVar61 - fVar2 * fVar59) * fVar4
                  ;
                  uVar43 = uVar43 + 1;
                  pAVar32 = (Accessor *)&(pAVar32->super_Object).id;
                  lVar25 = lVar25 + 0xc;
                  paVar22 = local_f8;
                } while (uVar43 < local_f8->mNumVertices);
              }
              operator_delete__(local_e8.accessor);
            }
          }
LAB_00646aba:
          psVar52 = &local_e8.elemSize;
          pRVar26 = (local_f0->attributes).color.
                    super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(local_f0->attributes).color.
                       super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
               + 8) != pRVar26) {
            lVar25 = 0x30;
            uVar43 = 0;
            do {
              pAVar32 = *(Accessor **)
                         (**(long **)((long)&pRVar26[-6].vector + lVar25 * 2) +
                         (ulong)*(uint *)((long)pRVar26 + lVar25 * 2 + -0x58) * 8);
              if (pAVar32->count == (ulong)local_f8->mNumVertices) {
                glTF2::Accessor::ExtractData<aiColor4t<float>>
                          (pAVar32,(aiColor4t<float> **)((long)local_f8->mColors + lVar25 + -0x30));
              }
              else {
                pLVar28 = DefaultLogger::get();
                std::operator+(&local_88,"Color stream size in mesh \"",local_50);
                plVar29 = (long *)std::__cxx11::string::append((char *)&local_88);
                pAVar32 = (Accessor *)(plVar29 + 2);
                if ((Accessor *)*plVar29 == pAVar32) {
                  local_e8.elemSize = (size_t)(pAVar32->super_Object)._vptr_Object;
                  local_e8.stride = plVar29[3];
                  local_e8.accessor = (Accessor *)psVar52;
                }
                else {
                  local_e8.elemSize = (size_t)(pAVar32->super_Object)._vptr_Object;
                  local_e8.accessor = (Accessor *)*plVar29;
                }
                local_e8.data = (uint8_t *)plVar29[1];
                *plVar29 = (long)pAVar32;
                plVar29[1] = 0;
                *(undefined1 *)(plVar29 + 2) = 0;
                Logger::warn(pLVar28,(char *)local_e8.accessor);
                if (local_e8.accessor != (Accessor *)psVar52) {
                  operator_delete(local_e8.accessor,local_e8.elemSize + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
              }
              if (6 < uVar43) break;
              uVar43 = uVar43 + 1;
              pRVar26 = (local_f0->attributes).color.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar25 = lVar25 + 8;
            } while (uVar43 < (ulong)((long)*(pointer *)
                                             ((long)&(local_f0->attributes).color.
                                                                                                          
                                                  super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                             + 8) - (long)pRVar26 >> 4));
          }
          pRVar26 = (local_f0->attributes).texcoord.
                    super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(local_f0->attributes).texcoord.
                       super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
               + 8) != pRVar26) {
            uVar43 = 0;
            do {
              pAVar32 = *(Accessor **)
                         (*(long *)&((pRVar26[uVar43].vector)->
                                    super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                    )._M_impl + (ulong)pRVar26[uVar43].index * 8);
              if (pAVar32->count == (ulong)local_f8->mNumVertices) {
                glTF2::Accessor::ExtractData<aiVector3t<float>>
                          (pAVar32,local_f8->mTextureCoords + uVar43);
                lVar25 = *(long *)&(local_f0->attributes).texcoord.
                                   super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                   ._M_impl.super__Vector_impl_data;
                local_f8->mNumUVComponents[uVar43] =
                     *(uint *)(&DAT_0080ce08 +
                              (ulong)*(uint *)(*(long *)(**(long **)(lVar25 + uVar43 * 0x10) +
                                                        (ulong)*(uint *)(lVar25 + 8 + uVar43 * 0x10)
                                                        * 8) + 0x78) * 0x10);
                if (local_f8->mNumVertices != 0) {
                  pfVar27 = &local_f8->mTextureCoords[uVar43]->y;
                  uVar41 = 0;
                  do {
                    *pfVar27 = 1.0 - *pfVar27;
                    uVar41 = uVar41 + 1;
                    pfVar27 = pfVar27 + 3;
                  } while (uVar41 < local_f8->mNumVertices);
                }
              }
              else {
                pLVar28 = DefaultLogger::get();
                std::operator+(&local_88,"Texcoord stream size in mesh \"",local_50);
                plVar29 = (long *)std::__cxx11::string::append((char *)&local_88);
                pAVar32 = (Accessor *)(plVar29 + 2);
                if ((Accessor *)*plVar29 == pAVar32) {
                  local_e8.elemSize = (size_t)(pAVar32->super_Object)._vptr_Object;
                  local_e8.stride = plVar29[3];
                  local_e8.accessor = (Accessor *)psVar52;
                }
                else {
                  local_e8.elemSize = (size_t)(pAVar32->super_Object)._vptr_Object;
                  local_e8.accessor = (Accessor *)*plVar29;
                }
                local_e8.data = (uint8_t *)plVar29[1];
                *plVar29 = (long)pAVar32;
                plVar29[1] = 0;
                *(undefined1 *)(plVar29 + 2) = 0;
                Logger::warn(pLVar28,(char *)local_e8.accessor);
                if (local_e8.accessor != (Accessor *)psVar52) {
                  operator_delete(local_e8.accessor,local_e8.elemSize + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
              }
              if (6 < uVar43) break;
              uVar43 = uVar43 + 1;
              pRVar26 = (local_f0->attributes).texcoord.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar43 < (ulong)((long)*(pointer *)
                                             ((long)&(local_f0->attributes).texcoord.
                                                                                                          
                                                  super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                             + 8) - (long)pRVar26 >> 4));
          }
          paVar22 = local_f8;
          lVar25 = (long)*(pointer *)
                          ((long)&(local_f0->targets).
                                  super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                  ._M_impl + 8) -
                   *(long *)&(local_f0->targets).
                             super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                             ._M_impl.super__Vector_impl_data;
          if (lVar25 != 0) {
            lVar25 = lVar25 >> 3;
            local_f8->mNumAnimMeshes = (int)lVar25 * 0x38e38e39;
            ppaVar30 = (aiAnimMesh **)operator_new__(lVar25 * 0x71c71c71c71c71c8 & 0x7fffffff8);
            paVar22->mAnimMeshes = ppaVar30;
            if (*(pointer *)
                 ((long)&(local_f0->targets).
                         super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                         ._M_impl + 8) !=
                (local_f0->targets).
                super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar43 = 0;
              do {
                paVar31 = aiCreateAnimMesh(local_f8);
                local_f8->mAnimMeshes[uVar43] = paVar31;
                paVar31 = local_f8->mAnimMeshes[uVar43];
                plVar29 = (long *)(*(long *)&(local_f0->targets).
                                             super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                             ._M_impl.super__Vector_impl_data + uVar43 * 0x48);
                if (plVar29[1] != *plVar29) {
                  local_e8.accessor = (Accessor *)0x0;
                  glTF2::Accessor::ExtractData<aiVector3t<float>>
                            (*(Accessor **)
                              (**(long **)*plVar29 +
                              (ulong)*(uint *)((undefined8 *)*plVar29 + 1) * 8),
                             (aiVector3t<float> **)&local_e8);
                  if (local_f8->mNumVertices != 0) {
                    lVar25 = 8;
                    uVar41 = 0;
                    do {
                      paVar24 = paVar31->mVertices;
                      *(float *)((long)paVar24 + lVar25 + -8) =
                           *(float *)((long)local_e8.accessor + lVar25 + -8) +
                           *(float *)((long)paVar24 + lVar25 + -8);
                      *(float *)((long)paVar24 + lVar25 + -4) =
                           *(float *)((long)local_e8.accessor + lVar25 + -4) +
                           *(float *)((long)paVar24 + lVar25 + -4);
                      *(float *)((long)&paVar24->x + lVar25) =
                           *(float *)((long)&((local_e8.accessor)->super_Object)._vptr_Object +
                                     lVar25) + *(float *)((long)&paVar24->x + lVar25);
                      uVar41 = uVar41 + 1;
                      lVar25 = lVar25 + 0xc;
                    } while (uVar41 < local_f8->mNumVertices);
                  }
                  if (local_e8.accessor != (Accessor *)0x0) {
                    operator_delete__(local_e8.accessor);
                  }
                }
                if (plVar29[4] != plVar29[3]) {
                  local_e8.accessor = (Accessor *)0x0;
                  glTF2::Accessor::ExtractData<aiVector3t<float>>
                            (*(Accessor **)
                              (**(long **)plVar29[3] +
                              (ulong)*(uint *)((undefined8 *)plVar29[3] + 1) * 8),
                             (aiVector3t<float> **)&local_e8);
                  if (local_f8->mNumVertices != 0) {
                    lVar25 = 8;
                    uVar41 = 0;
                    do {
                      paVar24 = paVar31->mNormals;
                      *(float *)((long)paVar24 + lVar25 + -8) =
                           *(float *)((long)local_e8.accessor + lVar25 + -8) +
                           *(float *)((long)paVar24 + lVar25 + -8);
                      *(float *)((long)paVar24 + lVar25 + -4) =
                           *(float *)((long)local_e8.accessor + lVar25 + -4) +
                           *(float *)((long)paVar24 + lVar25 + -4);
                      *(float *)((long)&paVar24->x + lVar25) =
                           *(float *)((long)&((local_e8.accessor)->super_Object)._vptr_Object +
                                     lVar25) + *(float *)((long)&paVar24->x + lVar25);
                      uVar41 = uVar41 + 1;
                      lVar25 = lVar25 + 0xc;
                    } while (uVar41 < local_f8->mNumVertices);
                  }
                  if (local_e8.accessor != (Accessor *)0x0) {
                    operator_delete__(local_e8.accessor);
                  }
                }
                if (plVar29[7] != plVar29[6]) {
                  local_e8.accessor = (Accessor *)0x0;
                  puVar38 = *(undefined8 **)
                             &(local_f0->attributes).tangent.
                              super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                              ._M_impl.super__Vector_impl_data;
                  glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                            (*(Accessor **)(*(long *)*puVar38 + (ulong)*(uint *)(puVar38 + 1) * 8),
                             (Tangent **)&local_e8);
                  local_88._M_dataplus._M_p = (pointer)0x0;
                  glTF2::Accessor::ExtractData<aiVector3t<float>>
                            (*(Accessor **)
                              (**(long **)plVar29[6] +
                              (ulong)*(uint *)((undefined8 *)plVar29[6] + 1) * 8),
                             (aiVector3t<float> **)&local_88);
                  if (local_f8->mNumVertices == 0) {
                    if (local_e8.accessor != (Accessor *)0x0) goto LAB_006470ec;
                  }
                  else {
                    lVar25 = 0;
                    uVar41 = 0;
                    pAVar32 = local_e8.accessor;
                    do {
                      *(float *)&(pAVar32->super_Object)._vptr_Object =
                           *(float *)(local_88._M_dataplus._M_p + lVar25) +
                           *(float *)&(pAVar32->super_Object)._vptr_Object;
                      *(float *)((long)&(pAVar32->super_Object)._vptr_Object + 4) =
                           *(float *)(local_88._M_dataplus._M_p + lVar25 + 4) +
                           *(float *)((long)&(pAVar32->super_Object)._vptr_Object + 4);
                      (pAVar32->super_Object).index =
                           (int)(*(float *)(local_88._M_dataplus._M_p + lVar25 + 8) +
                                (float)(pAVar32->super_Object).index);
                      paVar24 = paVar31->mTangents;
                      *(int *)((long)&paVar24->z + lVar25) =
                           (int)*(size_t *)&(pAVar32->super_Object).index;
                      *(_func_int ***)((long)&paVar24->x + lVar25) =
                           (pAVar32->super_Object)._vptr_Object;
                      fVar2 = *(float *)&(pAVar32->super_Object)._vptr_Object;
                      paVar24 = paVar31->mBitangents;
                      fVar3 = *(float *)((long)&paVar31->mNormals->x + lVar25);
                      fVar4 = (float)(pAVar32->super_Object).oIndex;
                      uVar5 = *(undefined8 *)((long)&paVar31->mNormals->y + lVar25);
                      uVar6 = *(undefined8 *)((long)&(pAVar32->super_Object)._vptr_Object + 4);
                      fVar59 = (float)uVar5;
                      fVar60 = (float)((ulong)uVar5 >> 0x20);
                      fVar61 = (float)uVar6;
                      fVar62 = (float)((ulong)uVar6 >> 0x20);
                      *(ulong *)((long)&paVar24->x + lVar25) =
                           CONCAT44(fVar4 * (fVar2 * fVar60 - fVar3 * fVar62),
                                    fVar4 * (fVar62 * fVar59 - fVar60 * fVar61));
                      *(float *)((long)&paVar24->z + lVar25) =
                           (fVar3 * fVar61 - fVar2 * fVar59) * fVar4;
                      uVar41 = uVar41 + 1;
                      lVar25 = lVar25 + 0xc;
                      pAVar32 = (Accessor *)&(pAVar32->super_Object).id;
                    } while (uVar41 < local_f8->mNumVertices);
LAB_006470ec:
                    operator_delete__(local_e8.accessor);
                  }
                  if (local_88._M_dataplus._M_p != (pointer)0x0) {
                    operator_delete__(local_88._M_dataplus._M_p);
                  }
                }
                lVar25 = *(long *)&(local_a0->weights).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data;
                if (uVar43 < (ulong)((long)*(pointer *)
                                            ((long)&(local_a0->weights).
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl + 8) - lVar25 >> 2)) {
                  paVar31->mWeight = *(float *)(lVar25 + uVar43 * 4);
                }
                uVar43 = uVar43 + 1;
              } while (uVar43 < (ulong)(((long)*(pointer *)
                                                ((long)&(local_f0->targets).
                                                                                                                
                                                  super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                                  ._M_impl + 8) -
                                         *(long *)&(local_f0->targets).
                                                                                                      
                                                  super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                                  ._M_impl.super__Vector_impl_data >> 3) *
                                       -0x71c71c71c71c71c7));
            }
          }
          pvVar11 = (local_f0->indices).vector;
          if (pvVar11 == (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
            PVar7 = local_f0->mode;
            if (PrimitiveMode_TRIANGLE_FAN < PVar7) goto switchD_006473a7_default;
            uVar19 = local_f8->mNumVertices;
            uVar43 = (ulong)uVar19;
            switch(PVar7) {
            case PrimitiveMode_POINTS:
              puVar33 = (ulong *)operator_new__(uVar43 * 0x10 + 8);
              *puVar33 = uVar43;
              paVar51 = (aiFace *)(puVar33 + 1);
              if (uVar19 != 0) {
                paVar34 = paVar51;
                do {
                  paVar34->mNumIndices = 0;
                  paVar34->mIndices = (uint *)0x0;
                  paVar34 = paVar34 + 1;
                } while (paVar34 != paVar51 + uVar43);
                if (uVar19 != 0) {
                  uVar54 = 0;
                  do {
                    *(undefined4 *)(puVar33 + 1) = 1;
                    puVar39 = (undefined4 *)operator_new__(4);
                    puVar33[2] = (ulong)puVar39;
                    *puVar39 = (int)uVar54;
                    uVar54 = uVar54 + 1;
                    uVar41 = uVar43;
                    puVar33 = puVar33 + 2;
                  } while (uVar43 != uVar54);
                  break;
                }
              }
              goto LAB_00647e1c;
            case PrimitiveMode_LINES:
              uVar47 = uVar19;
              if ((uVar19 & 0xfffffffe) != uVar19) {
                pLVar28 = DefaultLogger::get();
                Logger::warn(pLVar28,
                             "The number of vertices was not compatible with the LINES mode. Some vertices were dropped."
                            );
                uVar47 = uVar19 & 0xfffffffe;
              }
              uVar41 = (ulong)(uVar19 >> 1);
              puVar33 = (ulong *)operator_new__(uVar41 * 0x10 + 8);
              *puVar33 = uVar41;
              paVar51 = (aiFace *)(puVar33 + 1);
              if (1 < uVar19) {
                paVar34 = paVar51;
                do {
                  paVar34->mNumIndices = 0;
                  paVar34->mIndices = (uint *)0x0;
                  paVar34 = paVar34 + 1;
                } while (paVar34 != paVar51 + uVar41);
              }
              if (uVar47 != 0) {
                uVar19 = 0;
                do {
                  paVar51[uVar19 >> 1].mNumIndices = 2;
                  puVar36 = (uint *)operator_new__(8);
                  paVar51[uVar19 >> 1].mIndices = puVar36;
                  *puVar36 = uVar19;
                  puVar36[1] = uVar19 + 1;
                  uVar19 = uVar19 + 2;
                } while (uVar19 < uVar47);
              }
              break;
            default:
              uVar41 = (ulong)(uVar19 - (PVar7 == PrimitiveMode_LINE_STRIP));
              local_c0 = uVar41;
              puVar33 = (ulong *)operator_new__(uVar41 * 0x10 + 8);
              *puVar33 = local_c0;
              paVar51 = (aiFace *)(puVar33 + 1);
              if ((int)local_c0 != 0) {
                paVar34 = paVar51;
                do {
                  paVar34->mNumIndices = 0;
                  paVar34->mIndices = (uint *)0x0;
                  paVar34 = paVar34 + 1;
                } while (paVar34 != paVar51 + uVar41);
              }
              paVar51->mNumIndices = 2;
              puVar38 = (undefined8 *)operator_new__(8);
              puVar33[2] = (ulong)puVar38;
              *puVar38 = 0x100000000;
              if (2 < uVar19) {
                puVar53 = puVar33 + 4;
                uVar41 = 2;
                do {
                  uVar8 = *(undefined4 *)(puVar53[-2] + 4);
                  *(undefined4 *)(puVar53 + -1) = 2;
                  puVar39 = (undefined4 *)operator_new__(8);
                  *puVar53 = (ulong)puVar39;
                  *puVar39 = uVar8;
                  puVar39[1] = (int)uVar41;
                  uVar41 = uVar41 + 1;
                  puVar53 = puVar53 + 2;
                } while (uVar43 != uVar41);
              }
              if (local_f0->mode == PrimitiveMode_LINE_LOOP) {
                uVar47 = *(uint *)(puVar33[(ulong)(uVar19 - 2) * 2 + 2] + 4);
                uVar48 = *(uint *)puVar33[2];
                paVar51[uVar19 - 1].mNumIndices = 2;
                puVar36 = (uint *)operator_new__(8);
                paVar51[uVar19 - 1].mIndices = puVar36;
                *puVar36 = uVar47;
                puVar36[1] = uVar48;
              }
              goto LAB_006476b0;
            case PrimitiveMode_TRIANGLES:
              uVar41 = uVar43 / 3;
              uVar47 = uVar19;
              if (uVar41 * 3 != uVar43) {
                pLVar28 = DefaultLogger::get();
                Logger::warn(pLVar28,
                             "The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped."
                            );
                uVar47 = (uVar19 / 3) * 3;
              }
              puVar33 = (ulong *)operator_new__(uVar41 * 0x10 + 8);
              *puVar33 = uVar41;
              paVar51 = (aiFace *)(puVar33 + 1);
              if (2 < uVar19) {
                paVar34 = paVar51;
                do {
                  paVar34->mNumIndices = 0;
                  paVar34->mIndices = (uint *)0x0;
                  paVar34 = paVar34 + 1;
                } while (paVar34 != paVar51 + uVar41);
              }
              if (uVar47 != 0) {
                uVar19 = 0;
                do {
                  uVar43 = (ulong)uVar19 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                  *(undefined4 *)((long)&paVar51->mNumIndices + uVar43) = 3;
                  puVar36 = (uint *)operator_new__(0xc);
                  *(uint **)((long)&paVar51->mIndices + uVar43) = puVar36;
                  *puVar36 = uVar19;
                  puVar36[1] = uVar19 + 1;
                  puVar36[2] = uVar19 + 2;
                  uVar19 = uVar19 + 3;
                } while (uVar19 < uVar47);
              }
              break;
            case PrimitiveMode_TRIANGLE_STRIP:
              uVar19 = uVar19 - 2;
              uVar43 = (ulong)uVar19;
              puVar33 = (ulong *)operator_new__(uVar43 * 0x10 + 8);
              *puVar33 = uVar43;
              paVar51 = (aiFace *)(puVar33 + 1);
              if (uVar19 != 0) {
                paVar34 = paVar51;
                do {
                  paVar34->mNumIndices = 0;
                  paVar34->mIndices = (uint *)0x0;
                  paVar34 = paVar34 + 1;
                } while (paVar34 != paVar51 + uVar43);
                if (uVar19 != 0) {
                  uVar41 = 0;
                  do {
                    puVar53 = puVar33 + 2;
                    *(undefined4 *)(puVar33 + 1) = 3;
                    iVar44 = (int)uVar41;
                    if ((uVar41 & 1) == 0) {
                      piVar37 = (int *)operator_new__(0xc);
                      *puVar53 = (ulong)piVar37;
                      *piVar37 = iVar44;
                      piVar37[1] = iVar44 + 1;
                    }
                    else {
                      piVar37 = (int *)operator_new__(0xc);
                      *puVar53 = (ulong)piVar37;
                      *piVar37 = iVar44 + 1;
                      piVar37[1] = iVar44;
                    }
                    uVar41 = uVar41 + 1;
                    piVar37[2] = iVar44 + 2;
                    puVar33 = puVar53;
                  } while (uVar43 != uVar41);
                  uVar43 = (ulong)uVar19;
                  goto LAB_00647e39;
                }
              }
LAB_00647e1c:
              local_f8->mFaces = paVar51;
              local_f8->mNumFaces = 0;
              goto switchD_006473a7_default;
            case PrimitiveMode_TRIANGLE_FAN:
              uVar19 = uVar19 - 2;
              uVar43 = (ulong)uVar19;
              puVar33 = (ulong *)operator_new__(uVar43 * 0x10 + 8);
              *puVar33 = uVar43;
              paVar51 = (aiFace *)(puVar33 + 1);
              if (uVar19 != 0) {
                paVar34 = paVar51;
                do {
                  paVar34->mNumIndices = 0;
                  paVar34->mIndices = (uint *)0x0;
                  paVar34 = paVar34 + 1;
                } while (paVar34 != paVar51 + uVar43);
              }
              paVar51->mNumIndices = 3;
              puVar38 = (undefined8 *)operator_new__(0xc);
              puVar33[2] = (ulong)puVar38;
              *puVar38 = 0x100000000;
              *(undefined4 *)(puVar38 + 1) = 2;
              if (uVar19 < 2) {
                uVar43 = (ulong)uVar19;
                goto LAB_00647e39;
              }
              lVar25 = 0x10;
              iVar44 = 3;
              local_b0 = paVar51;
              do {
                uVar8 = *(undefined4 *)(*(long *)((long)puVar33 + lVar25) + 8);
                *(undefined4 *)((long)puVar33 + lVar25 + 8) = 3;
                puVar39 = (undefined4 *)operator_new__(0xc);
                *(undefined4 **)((long)puVar33 + lVar25 + 0x10) = puVar39;
                *puVar39 = 0;
                puVar39[1] = uVar8;
                puVar39[2] = iVar44;
                lVar25 = lVar25 + 0x10;
                iVar44 = iVar44 + 1;
                paVar51 = local_b0;
              } while (uVar43 * 0x10 != lVar25);
              goto LAB_00647e3e;
            }
LAB_00647e0b:
            uVar19 = (uint)uVar41;
            goto LAB_00647e3e;
          }
          pAVar32 = *(Accessor **)
                     (*(long *)&(pvVar11->
                                super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                )._M_impl + (ulong)(local_f0->indices).index * 8);
          local_c8 = pAVar32->count;
          pvVar12 = (pAVar32->bufferView).vector;
          if (pvVar12 == (vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *)0x0) {
LAB_006471fc:
            local_e8.data = (uint8_t *)0x0;
          }
          else {
            pBVar13 = (pvVar12->
                      super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start[(pAVar32->bufferView).index];
            pvVar14 = (pBVar13->buffer).vector;
            if (pvVar14 == (vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *)0x0)
            goto LAB_006471fc;
            lVar25 = *(long *)(*(long *)&pvVar14->
                                         super__Vector_base<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_>
                              + (ulong)(pBVar13->buffer).index * 8);
            lVar15 = *(long *)(lVar25 + 0x70);
            if (lVar15 == 0) goto LAB_006471fc;
            uVar43 = pBVar13->byteOffset + pAVar32->byteOffset;
            puVar33 = *(ulong **)(lVar25 + 0x68);
            if (puVar33 == (ulong *)0x0) {
LAB_0064732d:
              local_e8.data = (uint8_t *)(lVar15 + uVar43);
            }
            else {
              uVar41 = *puVar33;
              if ((uVar43 < uVar41) || (uVar41 + puVar33[3] <= uVar43)) goto LAB_0064732d;
              local_e8.data = (uint8_t *)((uVar43 - uVar41) + puVar33[2]);
            }
          }
          iVar44 = *(int *)(&DAT_0080ce08 + (ulong)pAVar32->type * 0x10);
          local_e8.accessor = pAVar32;
          uVar19 = glTF2::ComponentTypeSize(pAVar32->componentType);
          uVar41 = local_c8;
          local_e8.elemSize = (size_t)(uVar19 * iVar44);
          pvVar12 = (pAVar32->bufferView).vector;
          local_e8.stride = local_e8.elemSize;
          if ((pvVar12 != (vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *)0x0)
             && (pp_Var42 = (_func_int **)
                            (ulong)(pvVar12->
                                   super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start
                                   [(pAVar32->bufferView).index]->byteStride,
                pp_Var42 != (_func_int **)0x0)) {
            local_e8.stride = (size_t)pp_Var42;
          }
          if (local_e8.data == (uint8_t *)0x0) {
            __assert_fail("data.IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF2/glTF2Importer.cpp"
                          ,0x1e3,"void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
          }
          switch(local_f0->mode) {
          case PrimitiveMode_POINTS:
            uVar43 = local_c8 * 0x10 + 8;
            if (0xfffffffffffffff < local_c8) {
              uVar43 = 0xffffffffffffffff;
            }
            puVar33 = (ulong *)operator_new__(uVar43);
            uVar43 = local_c8;
            *puVar33 = local_c8;
            paVar51 = (aiFace *)(puVar33 + 1);
            if (local_c8 != 0) {
              paVar34 = paVar51;
              do {
                paVar34->mNumIndices = 0;
                paVar34->mIndices = (uint *)0x0;
                paVar34 = paVar34 + 1;
              } while (paVar34 != paVar51 + uVar41);
              if (local_c8 != 0) {
                uVar19 = 1;
                uVar41 = 0;
                do {
                  uVar47 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar19 - 1);
                  paVar51[uVar41].mNumIndices = 1;
                  puVar36 = (uint *)operator_new__(4);
                  paVar51[uVar41].mIndices = puVar36;
                  *puVar36 = uVar47;
                  uVar41 = (ulong)uVar19;
                  uVar19 = uVar19 + 1;
                } while (uVar41 < uVar43);
                break;
              }
            }
            goto LAB_00647806;
          case PrimitiveMode_LINES:
            uVar43 = local_c8 & 0xfffffffffffffffe;
            if (uVar43 != local_c8) {
              pLVar28 = DefaultLogger::get();
              Logger::warn(pLVar28,
                           "The number of vertices was not compatible with the LINES mode. Some vertices were dropped."
                          );
              uVar41 = uVar43;
            }
            uVar43 = local_c8 >> 1;
            local_c0 = uVar43;
            puVar33 = (ulong *)operator_new__(-(ulong)(local_c8 >> 0x3d != 0) | uVar43 * 0x10 | 8);
            *puVar33 = local_c0;
            paVar51 = (aiFace *)(puVar33 + 1);
            if (1 < local_c8) {
              paVar34 = paVar51;
              do {
                paVar34->mNumIndices = 0;
                paVar34->mIndices = (uint *)0x0;
                paVar34 = paVar34 + 1;
              } while (paVar34 != paVar51 + uVar43);
            }
            uVar43 = local_c0;
            if (uVar41 != 0) {
              uVar19 = 2;
              do {
                uVar20 = uVar19 - 2 >> 1;
                uVar47 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar19 - 2);
                uVar48 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar19 - 1);
                paVar51[uVar20].mNumIndices = 2;
                puVar36 = (uint *)operator_new__(8);
                paVar51[uVar20].mIndices = puVar36;
                *puVar36 = uVar47;
                puVar36[1] = uVar48;
                uVar43 = (ulong)uVar19;
                uVar19 = uVar19 + 2;
              } while (uVar43 < uVar41);
              goto LAB_006476b0;
            }
            break;
          case PrimitiveMode_LINE_LOOP:
          case PrimitiveMode_LINE_STRIP:
            uVar41 = local_c8 - (local_f0->mode == PrimitiveMode_LINE_STRIP);
            uVar43 = uVar41 * 0x10 + 8;
            if (0xfffffffffffffff < uVar41) {
              uVar43 = 0xffffffffffffffff;
            }
            local_c0 = uVar41;
            puVar33 = (ulong *)operator_new__(uVar43);
            *puVar33 = local_c0;
            paVar51 = (aiFace *)(puVar33 + 1);
            if (local_c0 != 0) {
              paVar34 = paVar51;
              do {
                paVar34->mNumIndices = 0;
                paVar34->mIndices = (uint *)0x0;
                paVar34 = paVar34 + 1;
              } while (paVar34 != paVar51 + uVar41);
            }
            uVar19 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,0);
            uVar47 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,1);
            paVar51->mNumIndices = 2;
            puVar36 = (uint *)operator_new__(8);
            puVar33[2] = (ulong)puVar36;
            *puVar36 = uVar19;
            puVar36[1] = uVar47;
            if (2 < local_c8) {
              uVar19 = 3;
              do {
                uVar47 = *(uint *)(puVar33[(ulong)(uVar19 - 3) * 2 + 2] + 4);
                uVar48 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar19 - 1);
                paVar51[uVar19 - 2].mNumIndices = 2;
                puVar36 = (uint *)operator_new__(8);
                paVar51[uVar19 - 2].mIndices = puVar36;
                *puVar36 = uVar47;
                puVar36[1] = uVar48;
                uVar43 = (ulong)uVar19;
                uVar19 = uVar19 + 1;
              } while (uVar43 < local_c8);
            }
            uVar43 = local_c8;
            if (local_f0->mode == PrimitiveMode_LINE_LOOP) {
              uVar19 = *(uint *)(puVar33[local_c8 * 2 + -2] + 4);
              uVar47 = *(uint *)puVar33[2];
              *(undefined4 *)(puVar33 + local_c8 * 2 + -1) = 2;
              puVar36 = (uint *)operator_new__(8);
              paVar51[uVar43 - 1].mIndices = puVar36;
              *puVar36 = uVar19;
              puVar36[1] = uVar47;
            }
LAB_006476b0:
            uVar19 = (uint)local_c0;
            goto LAB_00647e3e;
          case PrimitiveMode_TRIANGLES:
            local_c0 = local_c8 / 3;
            uVar43 = local_c0 * 3;
            local_a8 = local_c8;
            if (uVar43 != local_c8) {
              pLVar28 = DefaultLogger::get();
              Logger::warn(pLVar28,
                           "The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped."
                          );
              local_a8 = uVar43;
            }
            uVar41 = local_c0;
            uVar43 = local_c0 * 0x10 + 8;
            if (2 < (uint)(local_c8 >> 0x3c)) {
              uVar43 = 0xffffffffffffffff;
            }
            puVar33 = (ulong *)operator_new__(uVar43);
            *puVar33 = local_c0;
            paVar51 = (aiFace *)(puVar33 + 1);
            if (2 < local_c8) {
              paVar34 = paVar51;
              do {
                paVar34->mNumIndices = 0;
                paVar34->mIndices = (uint *)0x0;
                paVar34 = paVar34 + 1;
              } while (paVar34 != paVar51 + uVar41);
            }
            uVar43 = local_c0;
            if (local_a8 != 0) {
              uVar19 = 0;
              local_b0 = paVar51;
              do {
                uVar43 = (ulong)uVar19 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                uVar47 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar19);
                uVar48 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar19 + 1);
                uVar20 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar19 + 2);
                *(undefined4 *)((long)&local_b0->mNumIndices + uVar43) = 3;
                puVar36 = (uint *)operator_new__(0xc);
                *(uint **)((long)&local_b0->mIndices + uVar43) = puVar36;
                *puVar36 = uVar47;
                puVar36[1] = uVar48;
                puVar36[2] = uVar20;
                uVar47 = uVar19 + 3;
                uVar19 = uVar19 + 3;
                paVar51 = local_b0;
              } while (uVar47 < local_a8);
              goto LAB_006476b0;
            }
            break;
          case PrimitiveMode_TRIANGLE_STRIP:
            uVar41 = local_c8 - 2;
            uVar43 = uVar41 * 0x10 + 8;
            if (0xfffffffffffffff < uVar41) {
              uVar43 = 0xffffffffffffffff;
            }
            local_c8 = uVar41;
            puVar33 = (ulong *)operator_new__(uVar43);
            *puVar33 = local_c8;
            paVar51 = (aiFace *)(puVar33 + 1);
            if (local_c8 != 0) {
              paVar34 = paVar51;
              do {
                paVar34->mNumIndices = 0;
                paVar34->mIndices = (uint *)0x0;
                paVar34 = paVar34 + 1;
              } while (paVar34 != paVar51 + uVar41);
              if (local_c8 != 0) {
                uVar43 = 0;
                uVar19 = 1;
                local_b0 = paVar51;
                do {
                  uVar48 = uVar19 - 1;
                  paVar51 = local_b0 + uVar43;
                  uVar47 = uVar19 + 1;
                  if ((uVar48 & 1) == 0) {
                    uVar48 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar48);
                    local_a8 = CONCAT44(local_a8._4_4_,uVar48);
                    uVar48 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar19);
                    uVar20 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar47);
                    paVar51->mNumIndices = 3;
                    puVar36 = (uint *)operator_new__(0xc);
                  }
                  else {
                    uVar20 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar19);
                    local_a8 = CONCAT44(local_a8._4_4_,uVar20);
                    uVar48 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar48);
                    uVar20 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar47);
                    paVar51->mNumIndices = 3;
                    puVar36 = (uint *)operator_new__(0xc);
                  }
                  paVar51->mIndices = puVar36;
                  *puVar36 = (uint)local_a8;
                  puVar36[1] = uVar48;
                  puVar36[2] = uVar20;
                  uVar43 = (ulong)uVar19;
                  uVar41 = local_c8;
                  paVar51 = local_b0;
                  uVar19 = uVar47;
                } while (uVar43 < local_c8);
                goto LAB_00647e0b;
              }
            }
LAB_00647806:
            uVar43 = 0;
            break;
          case PrimitiveMode_TRIANGLE_FAN:
            uVar41 = local_c8 - 2;
            uVar43 = uVar41 * 0x10 + 8;
            if (0xfffffffffffffff < uVar41) {
              uVar43 = 0xffffffffffffffff;
            }
            local_c8 = uVar41;
            paVar34 = (aiFace *)operator_new__(uVar43);
            *(ulong *)paVar34 = local_c8;
            paVar51 = (aiFace *)&paVar34->mIndices;
            if (local_c8 != 0) {
              ppuVar35 = (uint **)paVar51;
              do {
                *(undefined4 *)ppuVar35 = 0;
                ppuVar35[1] = (uint *)0x0;
                ppuVar35 = ppuVar35 + 2;
              } while (ppuVar35 != (uint **)((long)paVar51 + uVar41 * 2 * 8));
            }
            uVar19 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,0);
            uVar47 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,1);
            uVar48 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,2);
            *(undefined4 *)paVar51 = 3;
            puVar36 = (uint *)operator_new__(0xc);
            *(uint **)(paVar34 + 1) = puVar36;
            *puVar36 = uVar19;
            puVar36[1] = uVar47;
            puVar36[2] = uVar48;
            uVar43 = local_c8;
            local_b0 = paVar34;
            if (1 < local_c8) {
              uVar41 = 1;
              iVar44 = 3;
              do {
                uVar19 = **(uint **)(local_b0 + 1);
                uVar47 = *(uint *)(*(ulong *)(paVar34 + (ulong)(iVar44 - 3) + 1) + 8);
                uVar48 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,iVar44);
                *(undefined4 *)((long)paVar51 + uVar41 * 2 * 8) = 3;
                puVar36 = (uint *)operator_new__(0xc);
                *(uint **)((long)paVar51 + (uVar41 * 2 + 1) * 8) = puVar36;
                *puVar36 = uVar19;
                puVar36[1] = uVar47;
                puVar36[2] = uVar48;
                uVar41 = (ulong)(iVar44 - 1);
                iVar44 = iVar44 + 1;
                uVar43 = local_c8;
              } while (uVar41 < local_c8);
            }
            break;
          default:
            goto switchD_006473a7_default;
          }
LAB_00647e39:
          uVar19 = (uint)uVar43;
LAB_00647e3e:
          local_f8->mFaces = paVar51;
          local_f8->mNumFaces = uVar19;
          if (uVar19 != 0) {
            uVar43 = 0;
            bVar56 = false;
            do {
              if ((ulong)paVar51[uVar43].mNumIndices != 0) {
                uVar41 = 0;
                do {
                  if (local_f8->mNumVertices <= paVar51[uVar43].mIndices[uVar41]) {
                    if (!bVar56) {
                      __assert_fail("CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF2/glTF2Importer.cpp"
                                    ,0x281,
                                    "void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
                    }
                    goto switchD_006473a7_default;
                  }
                  uVar41 = uVar41 + 1;
                } while (paVar51[uVar43].mNumIndices != uVar41);
              }
              uVar43 = uVar43 + 1;
              bVar56 = uVar19 <= uVar43;
            } while (uVar43 != uVar19);
          }
switchD_006473a7_default:
          if ((local_f0->material).vector ==
              (vector<glTF2::Material_*,_std::allocator<glTF2::Material_*>_> *)0x0) {
            uVar19 = local_98->mScene->mNumMaterials - 1;
          }
          else {
            uVar19 = (local_f0->material).index;
          }
          local_f8->mMaterialIndex = uVar19;
          local_90 = (ulong)((int)local_90 + 1);
          pPVar50 = (local_a0->primitives).
                    super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (local_90 <
                 (ulong)((long)*(pointer *)
                                ((long)&(local_a0->primitives).
                                        super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                        ._M_impl + 8) - (long)pPVar50 >> 8));
      }
      uVar55 = uVar55 + 1;
      ppMVar21 = (local_40->meshes).mObjs.
                 super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar55 < ((ulong)((long)(local_40->meshes).mObjs.
                                     super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar21) >>
                       3 & 0xffffffff));
  }
  pgVar17 = local_98;
  iVar9._M_current =
       (local_98->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar9._M_current ==
      (local_98->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98->meshOffsets,iVar9,
               &local_b4);
  }
  else {
    *iVar9._M_current = local_b4;
    ppuVar1 = &(local_98->meshOffsets).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  iVar18._M_current = iStack_60._M_current;
  ppaVar45 = local_68;
  paVar16 = pgVar17->mScene;
  uVar19 = (uint)((ulong)((long)iStack_60._M_current - (long)local_68) >> 3);
  paVar16->mNumMeshes = uVar19;
  ppaVar46 = local_68;
  if (uVar19 != 0) {
    ppaVar40 = (aiMesh **)operator_new__((long)iStack_60._M_current - (long)local_68 & 0x7fffffff8);
    paVar16->mMeshes = ppaVar40;
    ppaVar46 = ppaVar45;
    for (; ppaVar45 != iVar18._M_current; ppaVar45 = ppaVar45 + 1) {
      paVar22 = *ppaVar45;
      *ppaVar45 = *ppaVar40;
      *ppaVar40 = paVar22;
      ppaVar40 = ppaVar40 + 1;
      ppaVar46 = local_68;
    }
  }
  if (ppaVar46 != (aiMesh **)0x0) {
    operator_delete(ppaVar46,(long)local_58 - (long)ppaVar46);
  }
  return;
}

Assistant:

void glTF2Importer::ImportMeshes(glTF2::Asset &r) {
	std::vector<aiMesh *> meshes;

	unsigned int k = 0;

	for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
		Mesh &mesh = r.meshes[m];

		meshOffsets.push_back(k);
		k += unsigned(mesh.primitives.size());

		for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
			Mesh::Primitive &prim = mesh.primitives[p];

			aiMesh *aim = new aiMesh();
			meshes.push_back(aim);

			aim->mName = mesh.name.empty() ? mesh.id : mesh.name;

			if (mesh.primitives.size() > 1) {
				ai_uint32 &len = aim->mName.length;
				aim->mName.data[len] = '-';
				len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
			}

			switch (prim.mode) {
				case PrimitiveMode_POINTS:
					aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
					break;

				case PrimitiveMode_LINES:
				case PrimitiveMode_LINE_LOOP:
				case PrimitiveMode_LINE_STRIP:
					aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
					break;

				case PrimitiveMode_TRIANGLES:
				case PrimitiveMode_TRIANGLE_STRIP:
				case PrimitiveMode_TRIANGLE_FAN:
					aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
					break;
			}

			Mesh::Primitive::Attributes &attr = prim.attributes;

			if (attr.position.size() > 0 && attr.position[0]) {
				aim->mNumVertices = static_cast<unsigned int>(attr.position[0]->count);
				attr.position[0]->ExtractData(aim->mVertices);
			}

			if (attr.normal.size() > 0 && attr.normal[0]) {
				attr.normal[0]->ExtractData(aim->mNormals);

				// only extract tangents if normals are present
				if (attr.tangent.size() > 0 && attr.tangent[0]) {
					// generate bitangents from normals and tangents according to spec
					Tangent *tangents = nullptr;

					attr.tangent[0]->ExtractData(tangents);

					aim->mTangents = new aiVector3D[aim->mNumVertices];
					aim->mBitangents = new aiVector3D[aim->mNumVertices];

					for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
						aim->mTangents[i] = tangents[i].xyz;
						aim->mBitangents[i] = (aim->mNormals[i] ^ tangents[i].xyz) * tangents[i].w;
					}

					delete[] tangents;
				}
			}

			for (size_t c = 0; c < attr.color.size() && c < AI_MAX_NUMBER_OF_COLOR_SETS; ++c) {
				if (attr.color[c]->count != aim->mNumVertices) {
					DefaultLogger::get()->warn("Color stream size in mesh \"" + mesh.name +
											   "\" does not match the vertex count");
					continue;
				}
				attr.color[c]->ExtractData(aim->mColors[c]);
			}
			for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
				if (attr.texcoord[tc]->count != aim->mNumVertices) {
					DefaultLogger::get()->warn("Texcoord stream size in mesh \"" + mesh.name +
											   "\" does not match the vertex count");
					continue;
				}

				attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
				aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

				aiVector3D *values = aim->mTextureCoords[tc];
				for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
					values[i].y = 1 - values[i].y; // Flip Y coords
				}
			}

			std::vector<Mesh::Primitive::Target> &targets = prim.targets;
			if (targets.size() > 0) {
				aim->mNumAnimMeshes = (unsigned int)targets.size();
				aim->mAnimMeshes = new aiAnimMesh *[aim->mNumAnimMeshes];
				for (size_t i = 0; i < targets.size(); i++) {
					aim->mAnimMeshes[i] = aiCreateAnimMesh(aim);
					aiAnimMesh &aiAnimMesh = *(aim->mAnimMeshes[i]);
					Mesh::Primitive::Target &target = targets[i];

					if (target.position.size() > 0) {
						aiVector3D *positionDiff = nullptr;
						target.position[0]->ExtractData(positionDiff);
						for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
							aiAnimMesh.mVertices[vertexId] += positionDiff[vertexId];
						}
						delete[] positionDiff;
					}
					if (target.normal.size() > 0) {
						aiVector3D *normalDiff = nullptr;
						target.normal[0]->ExtractData(normalDiff);
						for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
							aiAnimMesh.mNormals[vertexId] += normalDiff[vertexId];
						}
						delete[] normalDiff;
					}
					if (target.tangent.size() > 0) {
						Tangent *tangent = nullptr;
						attr.tangent[0]->ExtractData(tangent);

						aiVector3D *tangentDiff = nullptr;
						target.tangent[0]->ExtractData(tangentDiff);

						for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; ++vertexId) {
							tangent[vertexId].xyz += tangentDiff[vertexId];
							aiAnimMesh.mTangents[vertexId] = tangent[vertexId].xyz;
							aiAnimMesh.mBitangents[vertexId] = (aiAnimMesh.mNormals[vertexId] ^ tangent[vertexId].xyz) * tangent[vertexId].w;
						}
						delete[] tangent;
						delete[] tangentDiff;
					}
					if (mesh.weights.size() > i) {
						aiAnimMesh.mWeight = mesh.weights[i];
					}
				}
			}

			aiFace *faces = nullptr;
			size_t nFaces = 0;

			if (prim.indices) {
				size_t count = prim.indices->count;

				Accessor::Indexer data = prim.indices->GetIndexer();
				ai_assert(data.IsValid());

				switch (prim.mode) {
					case PrimitiveMode_POINTS: {
						nFaces = count;
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; ++i) {
							SetFace(faces[i], data.GetUInt(i));
						}
						break;
					}

					case PrimitiveMode_LINES: {
						nFaces = count / 2;
						if (nFaces * 2 != count) {
							ASSIMP_LOG_WARN("The number of vertices was not compatible with the LINES mode. Some vertices were dropped.");
							count = nFaces * 2;
						}
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; i += 2) {
							SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
						}
						break;
					}

					case PrimitiveMode_LINE_LOOP:
					case PrimitiveMode_LINE_STRIP: {
						nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
						faces = new aiFace[nFaces];
						SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
						for (unsigned int i = 2; i < count; ++i) {
							SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
						}
						if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
							SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
						}
						break;
					}

					case PrimitiveMode_TRIANGLES: {
						nFaces = count / 3;
						if (nFaces * 3 != count) {
							ASSIMP_LOG_WARN("The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped.");
							count = nFaces * 3;
						}
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; i += 3) {
							SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
						}
						break;
					}
					case PrimitiveMode_TRIANGLE_STRIP: {
						nFaces = count - 2;
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < nFaces; ++i) {
							//The ordering is to ensure that the triangles are all drawn with the same orientation
							if ((i + 1) % 2 == 0) {
								//For even n, vertices n + 1, n, and n + 2 define triangle n
								SetFace(faces[i], data.GetUInt(i + 1), data.GetUInt(i), data.GetUInt(i + 2));
							} else {
								//For odd n, vertices n, n+1, and n+2 define triangle n
								SetFace(faces[i], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
							}
						}
						break;
					}
					case PrimitiveMode_TRIANGLE_FAN:
						nFaces = count - 2;
						faces = new aiFace[nFaces];
						SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
						for (unsigned int i = 1; i < nFaces; ++i) {
							SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i + 2));
						}
						break;
				}
			} else { // no indices provided so directly generate from counts

				// use the already determined count as it includes checks
				unsigned int count = aim->mNumVertices;

				switch (prim.mode) {
					case PrimitiveMode_POINTS: {
						nFaces = count;
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; ++i) {
							SetFace(faces[i], i);
						}
						break;
					}

					case PrimitiveMode_LINES: {
						nFaces = count / 2;
						if (nFaces * 2 != count) {
							ASSIMP_LOG_WARN("The number of vertices was not compatible with the LINES mode. Some vertices were dropped.");
							count = (unsigned int)nFaces * 2;
						}
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; i += 2) {
							SetFace(faces[i / 2], i, i + 1);
						}
						break;
					}

					case PrimitiveMode_LINE_LOOP:
					case PrimitiveMode_LINE_STRIP: {
						nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
						faces = new aiFace[nFaces];
						SetFace(faces[0], 0, 1);
						for (unsigned int i = 2; i < count; ++i) {
							SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
						}
						if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
							SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
						}
						break;
					}

					case PrimitiveMode_TRIANGLES: {
						nFaces = count / 3;
						if (nFaces * 3 != count) {
							ASSIMP_LOG_WARN("The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped.");
							count = (unsigned int)nFaces * 3;
						}
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; i += 3) {
							SetFace(faces[i / 3], i, i + 1, i + 2);
						}
						break;
					}
					case PrimitiveMode_TRIANGLE_STRIP: {
						nFaces = count - 2;
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < nFaces; ++i) {
							//The ordering is to ensure that the triangles are all drawn with the same orientation
							if ((i + 1) % 2 == 0) {
								//For even n, vertices n + 1, n, and n + 2 define triangle n
								SetFace(faces[i], i + 1, i, i + 2);
							} else {
								//For odd n, vertices n, n+1, and n+2 define triangle n
								SetFace(faces[i], i, i + 1, i + 2);
							}
						}
						break;
					}
					case PrimitiveMode_TRIANGLE_FAN:
						nFaces = count - 2;
						faces = new aiFace[nFaces];
						SetFace(faces[0], 0, 1, 2);
						for (unsigned int i = 1; i < nFaces; ++i) {
							SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], i + 2);
						}
						break;
				}
			}

			if (nullptr != faces) {
				aim->mFaces = faces;
				aim->mNumFaces = static_cast<unsigned int>(nFaces);
				ai_assert(CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices));
			}

			if (prim.material) {
				aim->mMaterialIndex = prim.material.GetIndex();
			} else {
				aim->mMaterialIndex = mScene->mNumMaterials - 1;
			}
		}
	}

	meshOffsets.push_back(k);

	CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}